

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O2

void __thiscall DefaultErrorHandler::error(DefaultErrorHandler *this,char *param_2)

{
  return;
}

Assistant:

void error(const char*) {
#endif  
    // As far as I can tell, throwing an exception here is a bug, unless
    // the intention is that the program should exit.  Throughout the code,
    // calls to error() are followed by cleanup code that does things like
    // closing a failed socket.  Thus it would seem that it should be
    // possible to continue execution.  But if the user just catches the
    // exception that's thrown here, the library ends up in a bogus state.
    // So I'm commenting out the throw.  - BPG
    //
    //throw std::runtime_error(msg);
  }